

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProgramInterfaces.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderProgramInterfaces::iterate(TessellationShaderProgramInterfaces *this)

{
  uint uVar1;
  GLenum property;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TessellationShaderProgramInterfaces *pTVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  GLuint GVar10;
  undefined4 extraout_var;
  long lVar11;
  TestError *this_00;
  NotSupportedError *this_01;
  GLint n_resource;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  char *local_1f8;
  char *local_1f0;
  GLint te_property_value;
  GLint tc_property_value;
  GLenum tc_property;
  long local_1d8;
  GLenum te_property;
  TessellationShaderProgramInterfaces *local_1c8;
  long local_1c0;
  ulong local_1b8;
  GLint n_active_resources;
  uint uStack_1ac;
  ostringstream local_1a8 [376];
  
  iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1d8 = CONCAT44(extraout_var,iVar7);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n_active_resources,
               "Tessellation shader functionality not supported, skipping",
               (allocator<char> *)&tc_property);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)&n_active_resources);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  lVar11 = 0;
  local_1c8 = this;
  do {
    if (lVar11 == 7) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    uVar1 = (&DAT_017b6a50)[lVar11];
    uVar14 = (ulong)uVar1;
    local_1c0 = lVar11;
    if ((int)lVar11 - 3U < 2) {
      if (this->m_is_shader_storage_blocks_supported != false) {
LAB_00d13807:
        bVar2 = false;
        goto LAB_00d1380f;
      }
    }
    else {
      if (lVar11 != 2) goto LAB_00d13807;
      bVar2 = true;
      if (this->m_is_atomic_counters_supported != true) goto LAB_00d137fd;
LAB_00d1380f:
      local_1f0 = (char *)0x0;
      local_1f8 = (char *)0x0;
      switch(uVar1) {
      case 0x92e1:
        local_1f0 = "tc_uniform1";
        local_1f8 = "te_uniform1";
        break;
      case 0x92e2:
        local_1f0 = "tc_uniform_block1";
        local_1f8 = "te_uniform_block1";
        break;
      case 0x92e3:
      case 0x92e4:
        break;
      case 0x92e5:
        local_1f0 = "tc_shader_storage_buffer_object_1";
        local_1f8 = "te_shader_storage_buffer_object_1";
        break;
      case 0x92e6:
        local_1f0 = "tc_shader_storage_block1";
        local_1f8 = "te_shader_storage_block1";
        break;
      default:
        local_1f8 = (char *)0x0;
        if (uVar1 != 0x92c0) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized interface type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                     ,0x1a3);
LAB_00d13bce:
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      local_1b8 = uVar14;
      for (iVar7 = 0; lVar11 = local_1d8, iVar7 != 2; iVar7 = iVar7 + 1) {
        if (bVar2) {
          if (iVar7 != 1) {
            _n_active_resources = (pointer)((ulong)uStack_1ac << 0x20);
            (**(code **)(local_1d8 + 0x990))(this->m_po_id,0x92c0,0x92f5,&n_active_resources);
            dVar8 = (**(code **)(lVar11 + 0x800))();
            glu::checkError(dVar8,"glGetProgramInterfaceiv() failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                            ,0x1bd);
            if (n_active_resources != 2) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Invalid amount of atomic counter buffer binding points reported",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                         ,0x1c1);
              goto LAB_00d13bce;
            }
            bVar3 = false;
            bVar4 = false;
            iVar9 = 2;
            for (iVar13 = 0; pTVar5 = local_1c8, lVar11 = local_1d8, iVar13 < iVar9;
                iVar13 = iVar13 + 1) {
              tc_property = (local_1c8->super_TestCaseBase).m_glExtTokens.
                            REFERENCED_BY_TESS_CONTROL_SHADER;
              tc_property_value = 0;
              te_property = (local_1c8->super_TestCaseBase).m_glExtTokens.
                            REFERENCED_BY_TESS_EVALUATION_SHADER;
              te_property_value = 0;
              (**(code **)(local_1d8 + 0x9c8))
                        (local_1c8->m_po_id,0x92c0,iVar13,1,&tc_property,1,0,&tc_property_value);
              dVar8 = (**(code **)(lVar11 + 0x800))();
              glu::checkError(dVar8,
                              "glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_CONTROL_SHADER_EXT property"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                              ,0x1d5);
              (**(code **)(lVar11 + 0x9c8))
                        (pTVar5->m_po_id,0x92c0,iVar13,1,&te_property,1,0,&te_property_value);
              dVar8 = (**(code **)(lVar11 + 0x800))();
              glu::checkError(dVar8,
                              "glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_EVALUATION_SHADER_EXT property"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                              ,0x1dd);
              bVar6 = bVar3;
              if ((tc_property_value == 1) && (bVar6 = true, bVar3)) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "Tessellation control-specific atomic counter buffer is reported twice",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                           ,0x1e3);
                goto LAB_00d13bce;
              }
              bVar3 = bVar6;
              bVar6 = bVar4;
              if ((te_property_value == 1) && (bVar6 = true, bVar4)) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "Tessellation evaluation-specific atomic counter buffer is reported twice"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                           ,0x1ed);
                goto LAB_00d13bce;
              }
              bVar4 = bVar6;
              iVar9 = n_active_resources;
            }
            if ((!bVar3) || (uVar14 = local_1b8, this = local_1c8, !bVar4)) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,
                         "Either tessellation control or tessellation evaluation atomic counter buffer was not reported"
                         ,(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                         ,0x1f7);
              goto LAB_00d13bce;
            }
          }
        }
        else {
          property = (&(this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_TESS_CONTROL_SHADER)
                     [iVar7 != 0];
          pcVar12 = local_1f8;
          if (iVar7 == 0) {
            pcVar12 = local_1f0;
          }
          if (pcVar12 == (char *)0x0) {
            _n_active_resources = (pointer)((ulong)uStack_1ac << 0x20);
            (**(code **)(local_1d8 + 0x990))
                      (this->m_po_id,uVar14 & 0xffffffff,0x92f5,&n_active_resources);
            dVar8 = (**(code **)(lVar11 + 0x800))();
            glu::checkError(dVar8,"glGetProgramInterfaceiv() failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                            ,0x209);
            for (GVar10 = 0; (int)GVar10 < n_active_resources; GVar10 = GVar10 + 1) {
              verifyPropertyValue(this,(GLenum)uVar14,property,GVar10,0);
            }
          }
          else {
            GVar10 = (**(code **)(local_1d8 + 0x9a8))(this->m_po_id,uVar14 & 0xffffffff,pcVar12);
            dVar8 = (**(code **)(lVar11 + 0x800))();
            glu::checkError(dVar8,"glGetProgramResourceIndex() failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                            ,0x213);
            if (GVar10 == 0xffffffff) {
              _n_active_resources =
                   (pointer)((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::operator<<((ostream *)local_1a8,"Resource [");
              std::operator<<((ostream *)local_1a8,pcVar12);
              std::operator<<((ostream *)local_1a8,"] was not recognized.");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&n_active_resources,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Resource not recognized.",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProgramInterfaces.cpp"
                         ,0x21a);
              goto LAB_00d13bce;
            }
            verifyPropertyValue(this,(GLenum)uVar14,property,GVar10,1);
          }
        }
      }
    }
LAB_00d137fd:
    lVar11 = local_1c0 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderProgramInterfaces::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES objects needed to run the test */
	initTest();

	/* Iterate through all interfaces */
	const glw::GLenum interfaces[] = {
		GL_UNIFORM,			GL_UNIFORM_BLOCK, GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BLOCK,
		GL_BUFFER_VARIABLE, GL_PROGRAM_INPUT, GL_PROGRAM_OUTPUT
	};
	const unsigned int n_interfaces = sizeof(interfaces) / sizeof(interfaces[0]);

	for (unsigned int n_interface = 0; n_interface < n_interfaces; ++n_interface)
	{
		glw::GLenum interface = interfaces[n_interface];

		if ((interface == GL_SHADER_STORAGE_BLOCK || interface == GL_BUFFER_VARIABLE) &&
			!m_is_shader_storage_blocks_supported)
		{
			continue;
		}

		if (interface == GL_ATOMIC_COUNTER_BUFFER && !m_is_atomic_counters_supported)
		{
			continue;
		}

		/* For each interface, we want to check whether a specific resource
		 * is recognized by the implementation. If the name is unknown,
		 * the test should fail; if it's recognized, we should verify it's referenced
		 * by both TC and TE shaders
		 */
		const char* tc_resource_name = DE_NULL;
		const char* te_resource_name = DE_NULL;

		switch (interface)
		{
		case GL_UNIFORM:
		{
			tc_resource_name = "tc_uniform1";
			te_resource_name = "te_uniform1";

			break;
		}

		case GL_UNIFORM_BLOCK:
		{
			tc_resource_name = "tc_uniform_block1";
			te_resource_name = "te_uniform_block1";

			break;
		}

		case GL_ATOMIC_COUNTER_BUFFER:
		{
			/* Atomic counter buffers are tested in a separate codepath. */
			break;
		}

		case GL_SHADER_STORAGE_BLOCK:
		{
			tc_resource_name = "tc_shader_storage_block1";
			te_resource_name = "te_shader_storage_block1";

			break;
		}

		case GL_BUFFER_VARIABLE:
		{
			tc_resource_name = "tc_shader_storage_buffer_object_1";
			te_resource_name = "te_shader_storage_buffer_object_1";

			break;
		}

		case GL_PROGRAM_INPUT:
		{
			tc_resource_name = DE_NULL;
			te_resource_name = DE_NULL;

			break;
		}

		case GL_PROGRAM_OUTPUT:
		{
			tc_resource_name = DE_NULL;
			te_resource_name = DE_NULL;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized interface type");
		}
		} /* switch (interface) */

		/* Run in two iterations - first for TC, then for TE */
		for (int n_iteration = 0; n_iteration < 2; ++n_iteration)
		{
			glw::GLenum property = (n_iteration == 0) ? m_glExtTokens.REFERENCED_BY_TESS_CONTROL_SHADER :
														m_glExtTokens.REFERENCED_BY_TESS_EVALUATION_SHADER;

			if (interface == GL_ATOMIC_COUNTER_BUFFER)
			{
				/* We only need a single iteration run for this interface */
				if (n_iteration == 1)
				{
					continue;
				}

				/* Atomic counter buffers are not assigned names, hence they need to be
				 * tested slightly differently.
				 *
				 * Exactly two atomic counter buffers should be defined. Make sure that's the case.
				 */
				glw::GLint n_active_resources = 0;

				gl.getProgramInterfaceiv(m_po_id, interface, GL_ACTIVE_RESOURCES, &n_active_resources);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() failed.");

				if (n_active_resources != 2)
				{
					TCU_FAIL("Invalid amount of atomic counter buffer binding points reported");
				}

				/* Check both resources and make sure they report separate atomic counters */
				bool was_tc_atomic_counter_buffer_reported = false;
				bool was_te_atomic_counter_buffer_reported = false;

				for (int n_resource = 0; n_resource < n_active_resources; ++n_resource)
				{
					const glw::GLenum tc_property		= m_glExtTokens.REFERENCED_BY_TESS_CONTROL_SHADER;
					glw::GLint		  tc_property_value = 0;
					const glw::GLenum te_property		= m_glExtTokens.REFERENCED_BY_TESS_EVALUATION_SHADER;
					glw::GLint		  te_property_value = 0;

					gl.getProgramResourceiv(m_po_id, interface, n_resource, 1, /* propCount */
											&tc_property, 1,				   /* bufSize */
											NULL,							   /* length */
											&tc_property_value);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_CONTROL_SHADER_EXT property");

					gl.getProgramResourceiv(m_po_id, interface, n_resource, 1, /* propCount */
											&te_property, 1,				   /* bufSize */
											NULL,							   /* length */
											&te_property_value);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetProgramResourceiv() failed for GL_REFERENCED_BY_TESS_EVALUATION_SHADER_EXT property");

					if (tc_property_value == GL_TRUE)
					{
						if (was_tc_atomic_counter_buffer_reported)
						{
							TCU_FAIL("Tessellation control-specific atomic counter buffer is reported twice");
						}

						was_tc_atomic_counter_buffer_reported = true;
					}

					if (te_property_value == GL_TRUE)
					{
						if (was_te_atomic_counter_buffer_reported)
						{
							TCU_FAIL("Tessellation evaluation-specific atomic counter buffer is reported twice");
						}

						was_te_atomic_counter_buffer_reported = true;
					}
				} /* for (all active resources) */

				if (!was_tc_atomic_counter_buffer_reported || !was_te_atomic_counter_buffer_reported)
				{
					TCU_FAIL("Either tessellation control or tessellation evaluation atomic counter buffer was not "
							 "reported");
				}
			}
			else
			{
				/* Retrieve resource index first, as long as the name is not NULL.
				 * If it's NULL, the property's value is assumed to be GL_FALSE for
				 * all reported active resources.
				 **/
				const char* resource_name = (n_iteration == 0) ? tc_resource_name : te_resource_name;

				if (resource_name == DE_NULL)
				{
					/* Make sure the property has GL_FALSE value for any resources
					 * reported for this interface. */
					glw::GLint n_active_resources = 0;

					gl.getProgramInterfaceiv(m_po_id, interface, GL_ACTIVE_RESOURCES, &n_active_resources);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInterfaceiv() failed.");

					for (glw::GLint n_resource = 0; n_resource < n_active_resources; ++n_resource)
					{
						verifyPropertyValue(interface, property, n_resource, GL_FALSE);
					} /* for (all resource indices) */
				}
				else
				{
					glw::GLuint resource_index = gl.getProgramResourceIndex(m_po_id, interface, resource_name);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramResourceIndex() failed");

					if (resource_index == GL_INVALID_INDEX)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Resource [" << resource_name
										   << "] was not recognized." << tcu::TestLog::EndMessage;

						TCU_FAIL("Resource not recognized.");
					}

					/* Now that we know the index, we can check the GL_REFERENCED_BY_...
					 * property value */
					verifyPropertyValue(interface, property, resource_index, GL_TRUE);
				}
			} /* (interface != GL_ATOMIC_COUNTER_BUFFER) */
		}	 /* for (both iterations) */
	}		  /* for (all interfaces) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}